

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

NameSet * wasm::BranchUtils::getBranchTargets(NameSet *__return_storage_ptr__,Expression *ast)

{
  undefined1 local_120 [8];
  Scanner scanner;
  Expression *ast_local;
  
  scanner.targets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ast;
  getBranchTargets::Scanner::Scanner((Scanner *)local_120);
  Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::walk
            ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)local_120,
             (Expression **)&scanner.targets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
            (__return_storage_ptr__,
             (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
             &scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
              super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.currModule);
  getBranchTargets::Scanner::~Scanner((Scanner *)local_120);
  return __return_storage_ptr__;
}

Assistant:

inline NameSet getBranchTargets(Expression* ast) {
  struct Scanner
    : public PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>> {
    NameSet targets;

    void visitExpression(Expression* curr) {
      operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          targets.insert(name);
        }
      });
    }
  };
  Scanner scanner;
  scanner.walk(ast);
  return scanner.targets;
}